

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O0

uint8_t * quicly_encode_ack_frequency_frame
                    (uint8_t *dst,uint64_t sequence,uint64_t packet_tolerance,uint64_t max_ack_delay
                    ,int ignore_order)

{
  uint8_t *puVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  int in_R8D;
  undefined4 in_stack_ffffffffffffffd8;
  
  puVar1 = (uint8_t *)CONCAT71(in_register_00000009,in_CL);
  ptls_encode_quicint(puVar1,CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  ptls_encode_quicint(puVar1,CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  ptls_encode_quicint(puVar1,CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  puVar1 = ptls_encode_quicint(puVar1,CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  *puVar1 = in_R8D != 0;
  return puVar1 + 1;
}

Assistant:

inline uint8_t *quicly_encode_ack_frequency_frame(uint8_t *dst, uint64_t sequence, uint64_t packet_tolerance,
                                                  uint64_t max_ack_delay, int ignore_order)
{
    dst = quicly_encodev(dst, QUICLY_FRAME_TYPE_ACK_FREQUENCY);
    dst = quicly_encodev(dst, sequence);
    dst = quicly_encodev(dst, packet_tolerance);
    dst = quicly_encodev(dst, max_ack_delay);
    *dst++ = !!ignore_order;
    return dst;
}